

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_gc.c
# Opt level: O2

void zt_gc_protect(zt_gc_t *gc,void *value)

{
  long lVar1;
  long *plVar2;
  zt_elist_t *pzVar3;
  zt_elist *pzVar4;
  
  (*gc->clear_white)((zt_gc_collectable_t *)value);
  lVar1 = *value;
  plVar2 = *(long **)((long)value + 8);
  *plVar2 = lVar1;
  *(long **)(lVar1 + 8) = plVar2;
  pzVar3 = gc->grey;
  pzVar4 = pzVar3->next;
  pzVar4->prev = (zt_elist *)value;
  *(zt_elist **)((long)value + 8) = pzVar4;
  *(zt_elist_t **)value = pzVar3;
  pzVar3->next = (zt_elist *)value;
  *(byte *)((long)value + 0x10) = *(byte *)((long)value + 0x10) | 2;
  return;
}

Assistant:

void
zt_gc_protect(zt_gc_t *gc, void *value)
{
    zt_gc_collectable_t * mark;

    mark = (zt_gc_collectable_t    *)value;

    gc->clear_white(mark);
    zt_elist_remove(&mark->list);
    zt_elist_add(gc->grey, &mark->list);
    ZT_BIT_SET(mark->colour, protected);
}